

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O0

void __thiscall
ft::
treeBase<char,_int,_ft::pair<const_char,_int>,_ft::less<char>,_ft::allocator<ft::pair<const_char,_int>_>_>
::fixEraseViolation(treeBase<char,_int,_ft::pair<const_char,_int>,_ft::less<char>,_ft::allocator<ft::pair<const_char,_int>_>_>
                    *this,node *x)

{
  node *pnVar1;
  bool bVar2;
  node *local_28;
  node *w_1;
  node *w;
  node *x_local;
  treeBase<char,_int,_ft::pair<const_char,_int>,_ft::less<char>,_ft::allocator<ft::pair<const_char,_int>_>_>
  *this_local;
  
  w = x;
  while( true ) {
    pnVar1 = root(this);
    bVar2 = false;
    if (w != pnVar1) {
      bVar2 = w->colour == BLACK;
    }
    if (!bVar2) break;
    if (w == w->parent->left) {
      w_1 = w->parent->right;
      if (w_1->colour == RED) {
        w_1->colour = BLACK;
        w->parent->colour = RED;
        rotateLeft(this,w->parent);
        w_1 = w->parent->right;
      }
      if ((w_1->left->colour == BLACK) && (w_1->right->colour == BLACK)) {
        w_1->colour = RED;
        w = w->parent;
      }
      else {
        if (w_1->right->colour == BLACK) {
          w_1->left->colour = BLACK;
          w_1->colour = RED;
          rotateRight(this,w_1);
          w_1 = w->parent->right;
        }
        w_1->colour = w->parent->colour;
        w->parent->colour = BLACK;
        w_1->right->colour = BLACK;
        rotateLeft(this,w->parent);
        w = root(this);
      }
    }
    else if (w == w->parent->right) {
      local_28 = w->parent->left;
      if (local_28->colour == RED) {
        local_28->colour = BLACK;
        w->parent->colour = RED;
        rotateRight(this,w->parent);
        local_28 = w->parent->left;
      }
      if ((local_28->right->colour == BLACK) && (local_28->left->colour == BLACK)) {
        local_28->colour = RED;
        w = w->parent;
      }
      else {
        if (local_28->left->colour == BLACK) {
          local_28->right->colour = BLACK;
          local_28->colour = RED;
          rotateLeft(this,local_28);
          local_28 = w->parent->left;
        }
        local_28->colour = w->parent->colour;
        w->parent->colour = BLACK;
        local_28->left->colour = BLACK;
        rotateRight(this,w->parent);
        w = root(this);
      }
    }
  }
  w->colour = BLACK;
  return;
}

Assistant:

void	fixEraseViolation(node* x)
	{
		while (x != this->root() && x->colour == BLACK)
		{
			if (x == x->parent->left)
			{
				node*	w = x->parent->right;
				if (w->colour == RED)
				{
					w->colour = BLACK;
					x->parent->colour = RED;
					this->rotateLeft(x->parent);
					w = x->parent->right;
				}
				if (w->left->colour == BLACK && w->right->colour == BLACK)
				{
					w->colour = RED;
					x = x->parent;
				}
				else
				{
					if (w->right->colour == BLACK)
					{
						w->left->colour = BLACK;
						w->colour = RED;
						this->rotateRight(w);
						w = x->parent->right;
					}
					w->colour = x->parent->colour;
					x->parent->colour = BLACK;
					w->right->colour = BLACK;
					this->rotateLeft(x->parent);
					x = this->root();
				}
			}
			else if (x == x->parent->right)
			{
				node*	w = x->parent->left;
				if (w->colour == RED)
				{
					w->colour = BLACK;
					x->parent->colour = RED;
					this->rotateRight(x->parent);
					w = x->parent->left;
				}
				if (w->right->colour == BLACK && w->left->colour == BLACK)
				{
					w->colour = RED;
					x = x->parent;
				}
				else
				{
					if (w->left->colour == BLACK)
					{
						w->right->colour = BLACK;
						w->colour = RED;
						this->rotateLeft(w);
						w = x->parent->left;
					}
					w->colour = x->parent->colour;
					x->parent->colour = BLACK;
					w->left->colour = BLACK;
					this->rotateRight(x->parent);
					x = this->root();
				}
			}
		}
		x->colour = BLACK;
	}